

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmDirectoryId * __thiscall
cmMakefile::GetDirectoryId(cmDirectoryId *__return_storage_ptr__,cmMakefile *this)

{
  allocator<char> local_59;
  string local_58;
  char local_38 [8];
  char buf [32];
  cmMakefile *this_local;
  
  buf._24_8_ = this;
  snprintf(local_38,0x20,"(%p)",this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,local_38,&local_59);
  cmDirectoryId::cmDirectoryId(__return_storage_ptr__,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return __return_storage_ptr__;
}

Assistant:

cmDirectoryId cmMakefile::GetDirectoryId() const
{
  // Use the instance pointer value to uniquely identify this directory.
  // If we ever need to expose this to CMake language code we should
  // add a read-only property in cmMakefile::GetProperty.
  char buf[32];
  snprintf(buf, sizeof(buf), "(%p)",
           static_cast<void const*>(this)); // cast avoids format warning
  return std::string(buf);
}